

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

path * __thiscall
irr::io::SNamedPath::PathToName(path *__return_storage_ptr__,SNamedPath *this,path *p)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  char cVar5;
  
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  (__return_storage_ptr__->str)._M_string_length = 0;
  (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
  if (__return_storage_ptr__ != p) {
    ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    sVar2 = (__return_storage_ptr__->str)._M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (__return_storage_ptr__->str)._M_dataplus._M_p;
      sVar4 = 0;
      do {
        if (pcVar3[sVar4] == '\\') {
          pcVar3[sVar4] = '/';
        }
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
      sVar2 = (__return_storage_ptr__->str)._M_string_length;
      if (sVar2 != 0) {
        pcVar3 = (__return_storage_ptr__->str)._M_dataplus._M_p;
        sVar4 = 0;
        do {
          cVar1 = pcVar3[sVar4];
          cVar5 = cVar1 + ' ';
          if (0x19 < (int)cVar1 - 0x41U) {
            cVar5 = cVar1;
          }
          pcVar3[sVar4] = cVar5;
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path PathToName(const path &p) const
	{
		path name(p);
		name.replace('\\', '/');
		name.make_lower();
		return name;
	}